

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::makeBoolConstant(Builder *this,bool b,bool specConstant)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  iterator __position;
  Id IVar3;
  Op OVar4;
  Id IVar5;
  Instruction *pIVar6;
  uint uVar7;
  undefined7 in_register_00000011;
  Op OVar8;
  undefined7 in_register_00000031;
  ulong uVar9;
  Instruction *c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  Instruction *local_28;
  
  IVar3 = makeBoolType(this);
  OVar8 = (Op)CONCAT71(in_register_00000031,b);
  OVar4 = OpConstantFalse - OVar8;
  OVar8 = OVar8 ^ OpSpecConstantFalse;
  if ((int)CONCAT71(in_register_00000011,specConstant) == 0) {
    ppIVar2 = this->groupedConstants[0x14].
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (uint)((ulong)((long)this->groupedConstants[0x14].
                                 super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3);
    OVar8 = OVar4;
    if (0 < (int)uVar7) {
      uVar9 = 0;
      IVar5 = 0;
      do {
        pIVar6 = ppIVar2[uVar9];
        if ((pIVar6->typeId == IVar3) && (pIVar6->opCode == OVar4)) {
          IVar5 = pIVar6->resultId;
        }
        uVar9 = uVar9 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar9);
      if (IVar5 != 0) {
        return IVar5;
      }
    }
  }
  pIVar6 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  IVar5 = this->uniqueId + 1;
  this->uniqueId = IVar5;
  pIVar6->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar6->resultId = IVar5;
  pIVar6->typeId = IVar3;
  pIVar6->opCode = OVar8;
  (pIVar6->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar6->block = (Block *)0x0;
  local_30._M_head_impl = pIVar6;
  local_28 = pIVar6;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
  if (local_30._M_head_impl != (Instruction *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Instruction[1])();
  }
  __position._M_current =
       this->groupedConstants[0x14].
       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      this->groupedConstants[0x14].
      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>
              ((vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
               (this->groupedConstants + 0x14),__position,&local_28);
    pIVar6 = local_28;
  }
  else {
    *__position._M_current = pIVar6;
    pppIVar1 = &this->groupedConstants[0x14].
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  Module::mapInstruction(&this->module,pIVar6);
  return local_28->resultId;
}

Assistant:

Id Builder::makeBoolConstant(bool b, bool specConstant)
{
    Id typeId = makeBoolType();
    Instruction* constant;
    Op opcode = specConstant ? (b ? OpSpecConstantTrue : OpSpecConstantFalse) : (b ? OpConstantTrue : OpConstantFalse);

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = 0;
        for (int i = 0; i < (int)groupedConstants[OpTypeBool].size(); ++i) {
            constant = groupedConstants[OpTypeBool][i];
            if (constant->getTypeId() == typeId && constant->getOpCode() == opcode)
                existing = constant->getResultId();
        }

        if (existing)
            return existing;
    }

    // Make it
    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeBool].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}